

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O3

string * __thiscall re2::Regexp::ToString_abi_cxx11_(string *__return_storage_ptr__,Regexp *this)

{
  ToStringWalker w;
  Walker<int> local_38;
  string *local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Walker<int>::Walker(&local_38);
  local_38._vptr_Walker = (_func_int **)&PTR__Walker_00148df8;
  local_38.max_visits_ = 100000;
  local_20 = __return_storage_ptr__;
  Walker<int>::WalkInternal(&local_38,this,6,false);
  if (local_38.stopped_early_ == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  Walker<int>::~Walker(&local_38);
  return __return_storage_ptr__;
}

Assistant:

string Regexp::ToString() {
  string t;
  ToStringWalker w(&t);
  w.WalkExponential(this, PrecToplevel, 100000);
  if (w.stopped_early())
    t += " [truncated]";
  return t;
}